

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult
pmreg_access_xevcntr(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  uint uVar1;
  CPAccessResult CVar2;
  
  uVar1 = (uint)env->features;
  if ((uVar1 >> 0x1b & 1) == 0) goto LAB_00619d88;
  if ((uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 != 0) {
      uVar1 = env->pstate >> 2 & 3;
      goto LAB_00619d64;
    }
    if ((env->uncached_cpsr & 0x1f) != 0x10) goto LAB_00619d88;
  }
  else {
    if ((env->v7m).exception != 0) goto LAB_00619d88;
    uVar1 = ~(env->v7m).control[(env->v7m).secure] & 1;
LAB_00619d64:
    if (uVar1 != 0) goto LAB_00619d88;
  }
  if (((byte)(env->cp15).c9_pmuserenr >> 3 & isread) != 0) {
    return CP_ACCESS_OK;
  }
LAB_00619d88:
  CVar2 = pmreg_access(env,ri,false);
  return CVar2;
}

Assistant:

static CPAccessResult pmreg_access_xevcntr(CPUARMState *env,
                                           const ARMCPRegInfo *ri,
                                           bool isread)
{
    /* ER: event counter read trap control */
    if (arm_feature(env, ARM_FEATURE_V8)
        && arm_current_el(env) == 0
        && (env->cp15.c9_pmuserenr & (1 << 3)) != 0
        && isread) {
        return CP_ACCESS_OK;
    }

    return pmreg_access(env, ri, isread);
}